

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool,false,true>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int64_t *piVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  int64_t *local_88;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = rdata->micros;
      lVar8._0_4_ = rdata->months;
      lVar8._4_4_ = rdata->days;
      lVar12 = (lVar8 >> 0x20) + lVar7 / 86400000000;
      lVar6 = lVar12 % 0x1e;
      lVar8 = (long)(int)(undefined4)lVar8 + lVar12 / 0x1e;
      local_88 = &ldata->micros;
      iVar16 = 0;
      do {
        lVar12._0_4_ = ((interval_t *)(local_88 + -1))->months;
        lVar12._4_4_ = ((interval_t *)(local_88 + -1))->days;
        lVar13 = (lVar12 >> 0x20) + *local_88 / 86400000000;
        lVar12 = (long)(int)(undefined4)lVar12 + lVar13 / 0x1e;
        bVar5 = true;
        if (lVar12 <= lVar8) {
          if (lVar12 < lVar8) {
            bVar5 = false;
          }
          else {
            lVar13 = lVar13 % 0x1e;
            if (lVar13 <= lVar6) {
              bVar5 = lVar7 % 86400000000 < *local_88 % 86400000000 && lVar6 <= lVar13;
            }
          }
        }
        result_data[iVar16] = bVar5;
        iVar16 = iVar16 + 1;
        local_88 = local_88 + 2;
      } while (count != iVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    uVar15 = 0;
    do {
      uVar2 = puVar1[uVar15];
      uVar14 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar14 = count;
      }
      uVar4 = uVar14;
      if (uVar2 != 0) {
        uVar4 = uVar9;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar9 < uVar14) {
            lVar7 = rdata->micros;
            lVar13._0_4_ = rdata->months;
            lVar13._4_4_ = rdata->days;
            lVar12 = (lVar13 >> 0x20) + lVar7 / 86400000000;
            lVar8 = lVar12 % 0x1e;
            lVar12 = (long)(int)(undefined4)lVar13 + lVar12 / 0x1e;
            piVar10 = &ldata[uVar9].micros;
            do {
              lVar3._0_4_ = ((interval_t *)(piVar10 + -1))->months;
              lVar3._4_4_ = ((interval_t *)(piVar10 + -1))->days;
              lVar13 = (lVar3 >> 0x20) + *piVar10 / 86400000000;
              lVar6 = (long)(int)(undefined4)lVar3 + lVar13 / 0x1e;
              bVar5 = true;
              if (lVar6 <= lVar12) {
                if (lVar6 < lVar12) {
                  bVar5 = false;
                }
                else {
                  lVar13 = lVar13 % 0x1e;
                  if (lVar13 <= lVar8) {
                    bVar5 = lVar7 % 86400000000 < *piVar10 % 86400000000 && lVar8 <= lVar13;
                  }
                }
              }
              result_data[uVar9] = bVar5;
              uVar9 = uVar9 + 1;
              piVar10 = piVar10 + 2;
              uVar4 = uVar14;
            } while (uVar14 != uVar9);
          }
        }
        else if (uVar9 < uVar14) {
          piVar10 = &ldata[uVar9].micros;
          uVar11 = 0;
          do {
            if ((uVar2 >> (uVar11 & 0x3f) & 1) != 0) {
              lVar7._0_4_ = ((interval_t *)(piVar10 + -1))->months;
              lVar7._4_4_ = ((interval_t *)(piVar10 + -1))->days;
              lVar6._0_4_ = rdata->months;
              lVar6._4_4_ = rdata->days;
              lVar8 = (lVar7 >> 0x20) + *piVar10 / 86400000000;
              lVar7 = (long)(int)(undefined4)lVar7 + lVar8 / 0x1e;
              lVar12 = (lVar6 >> 0x20) + rdata->micros / 86400000000;
              lVar6 = (long)(int)(undefined4)lVar6 + lVar12 / 0x1e;
              bVar5 = true;
              if (lVar7 <= lVar6) {
                if (lVar7 < lVar6) {
                  bVar5 = false;
                }
                else {
                  lVar8 = lVar8 % 0x1e;
                  lVar12 = lVar12 % 0x1e;
                  bVar5 = true;
                  if (lVar8 <= lVar12) {
                    bVar5 = rdata->micros % 86400000000 < *piVar10 % 86400000000 && lVar12 <= lVar8;
                  }
                }
              }
              result_data[uVar11 + uVar9] = bVar5;
            }
            uVar11 = uVar11 + 1;
            piVar10 = piVar10 + 2;
            uVar4 = uVar14;
          } while (uVar14 - uVar9 != uVar11);
        }
      }
      uVar9 = uVar4;
      uVar15 = uVar15 + 1;
    } while (uVar15 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}